

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::Zone::reset(Zone *this,ResetPolicy resetPolicy)

{
  uint8_t *puVar1;
  int in_ESI;
  undefined8 *in_RDI;
  bool bVar2;
  Block *prev;
  Block *next;
  Block *initial;
  bool hasStatic;
  Block *cur;
  Block *in_stack_ffffffffffffffc0;
  Zone *pZVar3;
  Zone *in_stack_ffffffffffffffc8;
  Zone *pZVar4;
  Zone *local_20;
  
  local_20 = (Zone *)in_RDI[2];
  if (local_20 != (Zone *)_zeroBlock) {
    if (in_ESI == 1) {
      bVar2 = *(char *)((long)in_RDI + 0x1b) != '\0';
      puVar1 = Block::data((Block *)_zeroBlock);
      *in_RDI = puVar1;
      puVar1 = Block::data((Block *)_zeroBlock);
      in_RDI[1] = puVar1;
      in_RDI[2] = _zeroBlock;
      in_RDI[4] = (ulong)bVar2;
      pZVar4 = *(Zone **)((long)local_20 + 8);
      pZVar3 = local_20;
      do {
        local_20 = pZVar3;
        pZVar3 = *(Zone **)local_20;
        if ((pZVar3 == (Zone *)0x0) && (bVar2)) {
          *(long *)local_20 = 0;
          *(long *)((long)local_20 + 8) = 0;
          Zone_assignBlock(pZVar4,(Block *)0x0);
          local_20 = pZVar4;
          break;
        }
        free(local_20);
        local_20 = pZVar4;
      } while (pZVar3 != (Zone *)0x0);
      while (local_20 != (Zone *)0x0) {
        pZVar4 = *(Zone **)(local_20 + 8);
        free(local_20);
        local_20 = pZVar4;
      }
    }
    else {
      for (; *(long *)local_20 != 0; local_20 = *(Zone **)local_20) {
      }
      Zone_assignBlock(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void Zone::reset(ResetPolicy resetPolicy) noexcept {
  Block* cur = _block;

  // Can't be altered.
  if (cur == &_zeroBlock) {
    return;
  }

  if (resetPolicy == ResetPolicy::kHard) {
    bool hasStatic = hasStaticBlock();
    Block* initial = const_cast<Zone::Block*>(&_zeroBlock);

    _ptr = initial->data();
    _end = initial->data();
    _block = initial;
    _blockCount = size_t(hasStatic);

    // Since cur can be in the middle of the double-linked list, we have to traverse both directions (`prev` and
    // `next`) separately to visit all.
    Block* next = cur->next;
    do {
      Block* prev = cur->prev;

      if (prev == nullptr && hasStatic) {
        // If this is the first block and this Zone is actually a ZoneTmp then the first block cannot be freed.
        cur->prev = nullptr;
        cur->next = nullptr;
        Zone_assignBlock(this, cur);
        break;
      }

      ::free(cur);
      cur = prev;
    } while (cur);

    cur = next;
    while (cur) {
      next = cur->next;
      ::free(cur);
      cur = next;
    }
  }
  else {
    while (cur->prev) {
      cur = cur->prev;
    }
    Zone_assignBlock(this, cur);
  }
}